

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# safeint.h
# Opt level: O0

SafeInt<unsigned_long> mp::operator+(SafeInt<unsigned_long> a,SafeInt<unsigned_long> b)

{
  bool bVar1;
  unsigned_long uVar2;
  OverflowError *pOVar3;
  unsigned_long uVar4;
  void *pvVar5;
  SafeInt<unsigned_long> in_RSI;
  SafeInt<unsigned_long> in_RDI;
  unsigned_long b_value;
  unsigned_long a_value;
  OverflowError *in_stack_ffffffffffffffb0;
  OverflowError *this;
  SafeInt<unsigned_long> local_8;
  
  uVar2 = val(in_RDI);
  pOVar3 = (OverflowError *)val(in_RSI);
  bVar1 = fmt::internal::is_negative<unsigned_long>(0x15d35a);
  if (bVar1) {
    this = pOVar3;
    uVar4 = std::numeric_limits<unsigned_long>::min();
    if (this < (OverflowError *)(uVar4 - uVar2)) {
      pvVar5 = (void *)__cxa_allocate_exception(8);
      memset(pvVar5,0,8);
      OverflowError::OverflowError(this);
      __cxa_throw(pvVar5,&OverflowError::typeinfo,OverflowError::~OverflowError);
    }
  }
  else {
    uVar4 = std::numeric_limits<unsigned_long>::max();
    if ((OverflowError *)(uVar4 - uVar2) < pOVar3) {
      pvVar5 = (void *)__cxa_allocate_exception(8);
      memset(pvVar5,0,8);
      OverflowError::OverflowError(in_stack_ffffffffffffffb0);
      __cxa_throw(pvVar5,&OverflowError::typeinfo,OverflowError::~OverflowError);
    }
  }
  SafeInt<unsigned_long>::SafeInt(&local_8,(unsigned_long)(&pOVar3->super_exception + uVar2));
  return (SafeInt<unsigned_long>)local_8.value_;
}

Assistant:

inline SafeInt<T> operator+(SafeInt<T> a, SafeInt<T> b) {
  T a_value = val(a), b_value = val(b);
  if (!fmt::internal::is_negative(a_value)) {
    if (b_value > std::numeric_limits<T>::max() - a_value)
      throw OverflowError();
  } else if (b_value < std::numeric_limits<T>::min() - a_value)
    throw OverflowError();
  return a_value + b_value;
}